

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O1

int mp3dec_decode_frame(mp3dec_t *dec,uint8_t *mp3,int mp3_bytes,mp3d_sample_t *pcm,
                       mp3dec_frame_info_t *info)

{
  char *pcVar1;
  int *piVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  byte bVar6;
  ushort uVar7;
  short sVar8;
  short sVar9;
  uint16_t uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined8 uVar43;
  byte bVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  uint32_t uVar48;
  uint32_t uVar49;
  uint8_t *puVar50;
  bs_t *pbVar51;
  undefined1 *puVar52;
  float *pfVar53;
  byte bVar54;
  undefined1 uVar55;
  byte bVar56;
  ulong uVar57;
  long lVar58;
  undefined1 (*pauVar59) [16];
  long lVar60;
  uint uVar61;
  uint uVar62;
  undefined1 (*pauVar63) [16];
  uint uVar64;
  mp3dec_frame_info_t *pmVar65;
  uint uVar66;
  uint uVar67;
  undefined1 (*pauVar68) [16];
  uint uVar69;
  float *pfVar70;
  void *pvVar71;
  float *pfVar72;
  uint uVar73;
  undefined4 *__dest;
  void *__dest_00;
  float *pfVar74;
  byte bVar75;
  undefined1 *puVar76;
  float (*overlap) [288];
  uint uVar77;
  ulong uVar78;
  uint *puVar79;
  uint uVar80;
  long lVar81;
  byte bVar82;
  L3_gr_info_t *pLVar83;
  bs_t *pbVar84;
  mp3d_sample_t *pmVar85;
  ulong uVar86;
  ulong uVar87;
  byte *pbVar88;
  bool bVar89;
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 in_XMM1 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar94;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int iVar127;
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int iVar141;
  int iVar145;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  int frame_size;
  uint8_t scf_size [4];
  bs_t bs_frame [1];
  L12_scale_info sci [1];
  mp3dec_scratch_t scratch;
  byte *local_43d8;
  uint local_43c8;
  int local_43b8;
  byte local_43b4 [4];
  undefined1 (*local_43b0) [16];
  bs_t local_43a8;
  L3_gr_info_t *local_4398;
  mp3d_sample_t *local_4390;
  mp3dec_frame_info_t *local_4388;
  float *local_4380;
  ulong local_4378;
  float *local_4370;
  L3_gr_info_t *local_4368;
  uint8_t *local_4360;
  long local_4358;
  float *local_4350;
  uint8_t *local_4348;
  ulong local_4340;
  undefined4 local_4338;
  float fStack_4334;
  undefined4 local_4330;
  byte local_4038;
  byte local_4037;
  byte local_4036 [64];
  byte abStack_3ff6 [70];
  bs_t local_3fb0;
  uint8_t local_3fa0 [2816];
  L3_gr_info_t local_34a0 [4];
  float local_3420 [4];
  float afStack_3410 [10];
  undefined1 local_33e8 [20];
  undefined1 local_33d4 [2228];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  float local_2180 [2112];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar44 = 0;
  local_43b8 = 0;
  local_4390 = pcm;
  local_4388 = info;
  if (((4 < mp3_bytes) && (dec->header[0] == 0xff)) &&
     (iVar45 = hdr_compare(dec->header,mp3), iVar45 != 0)) {
    iVar45 = hdr_frame_bytes(mp3,dec->free_format_bytes);
    local_43b8 = 0;
    if ((mp3[2] & 2) != 0) {
      local_43b8 = (uint)((~mp3[1] & 6) == 0) * 3 + 1;
    }
    local_43b8 = local_43b8 + iVar45;
    if ((local_43b8 != mp3_bytes) &&
       ((mp3_bytes < local_43b8 + 4 || (iVar45 = hdr_compare(mp3,mp3 + local_43b8), iVar45 == 0))))
    {
      local_43b8 = 0;
    }
  }
  iVar45 = 0;
  if (local_43b8 == 0) {
    memset(dec,0,0x1a0c);
    iVar45 = mp3d_find_frame(mp3,mp3_bytes,&dec->free_format_bytes,&local_43b8);
    if (mp3_bytes < local_43b8 + iVar45 || local_43b8 == 0) {
      local_4388->frame_bytes = iVar45;
      return 0;
    }
  }
  *(undefined4 *)dec->header = *(undefined4 *)(mp3 + iVar45);
  local_4388->frame_bytes = local_43b8 + iVar45;
  local_4388->frame_offset = iVar45;
  local_4388->channels = (mp3[(long)iVar45 + 3] < 0xc0) + 1;
  puVar50 = mp3 + iVar45;
  local_4388->hz =
       (*(uint *)(hdr_sample_rate_hz_g_hz + (mp3[(long)iVar45 + 2] & 0xc)) >>
       ((mp3[(long)iVar45 + 1] & 8) == 0)) >> ((mp3[(long)iVar45 + 1] & 0x10) == 0);
  uVar66 = mp3[(long)iVar45 + 1] >> 1 & 3;
  local_4388->layer = 4 - uVar66;
  local_4388->bitrate_kbps =
       (uint)(byte)hdr_bitrate_kbps_halfrate
                   [(ulong)(mp3[(long)iVar45 + 2] >> 4) +
                    (long)(int)((mp3[(long)iVar45 + 1] >> 1 & 3) - 1) * 0xf +
                    (ulong)(mp3[(long)iVar45 + 1] >> 3 & 1) * 0x2d] * 2;
  if (local_4390 == (mp3d_sample_t *)0x0) {
    uVar66 = 0x180;
    if ((~puVar50[1] & 6) != 0) {
      uVar66 = 0x480 >> ((puVar50[1] & 0xe) == 2);
    }
  }
  else {
    local_43a8.buf = puVar50 + 4;
    local_43a8.pos = 0;
    local_43a8.limit = local_43b8 * 8 + -0x20;
    bVar75 = puVar50[1];
    if ((bVar75 & 1) == 0) {
      get_bits(&local_43a8,0x10);
    }
    if ((char)uVar66 == '\x01') {
      local_4348 = puVar50;
      iVar46 = L3_read_side_info(&local_43a8,local_34a0,puVar50);
      iVar45 = local_43a8.pos;
      if ((iVar46 < 0) ||
         (iVar47 = local_43a8.limit - local_43a8.pos, local_43a8.limit < local_43a8.pos)) {
        dec->header[0] = '\0';
        uVar66 = 1;
        bVar89 = false;
      }
      else {
        iVar127 = dec->reserv;
        iVar141 = iVar46;
        if (iVar127 < iVar46) {
          iVar141 = iVar127;
        }
        uVar78 = 0;
        uVar57 = (ulong)(uint)(iVar127 - iVar46);
        if (iVar127 - iVar46 < 1) {
          uVar57 = uVar78;
        }
        iVar145 = iVar47 + 7;
        if (-1 < iVar47) {
          iVar145 = iVar47;
        }
        memcpy(local_3fa0,dec->reserv_buf + uVar57,(long)iVar141);
        iVar47 = iVar45 + 7;
        if (-1 < iVar45) {
          iVar47 = iVar45;
        }
        memcpy(local_3fa0 + iVar141,local_43a8.buf + (iVar47 >> 3),(long)(iVar145 >> 3));
        local_3fb0.limit = ((iVar145 >> 3) + iVar141) * 8;
        local_3fb0.buf = local_3fa0;
        local_3fb0.pos = 0;
        if (iVar46 <= iVar127) {
          local_4350 = dec->qmf_state;
          pmVar65 = local_4388;
          pmVar85 = local_4390;
          do {
            local_4390 = pmVar85;
            memset(local_3420,0,0x1200);
            iVar45 = pmVar65->channels;
            local_4340 = uVar78;
            local_4398 = local_34a0 + iVar45 * (int)uVar78;
            local_4358 = (long)iVar45;
            auVar122._0_12_ = ZEXT812(0x3f800000);
            auVar122._12_4_ = 0;
            if (0 < (long)iVar45) {
              lVar58 = 0;
              do {
                local_4368 = local_4398 + lVar58;
                uVar3 = local_4398[lVar58].n_long_sfb;
                uVar4 = local_4398[lVar58].n_short_sfb;
                uVar7 = local_4398[lVar58].part_23_length;
                local_43b0 = (undefined1 (*) [16])
                             (L3_decode_scalefactors_g_scf_partitions +
                             (((ulong)(uVar3 == '\0') + 1) - (ulong)(uVar4 == '\0')) * 0x1c);
                bVar75 = local_4398[lVar58].scalefac_scale;
                local_4380 = (float *)lVar58;
                if ((dec->header[1] & 8) == 0) {
                  bVar54 = (dec->header[3] & 0x10) >> 4 & lVar58 != 0;
                  uVar66 = (uint)(local_4368->scalefac_compress >> bVar54);
                  uVar57 = 0;
                  if (bVar54 != 0) {
                    uVar57 = 0xc;
                  }
                  puVar76 = L3_decode_scalefactors_g_mod + uVar57;
                  do {
                    uVar78 = 1;
                    lVar81 = 3;
                    do {
                      bVar54 = puVar76[lVar81];
                      local_43b4[lVar81] = (byte)((uVar66 / uVar78) % (ulong)bVar54);
                      uVar77 = (int)uVar78 * (uint)bVar54;
                      uVar78 = (ulong)uVar77;
                      bVar89 = lVar81 != 0;
                      lVar81 = lVar81 + -1;
                    } while (bVar89);
                    uVar57 = uVar57 + 4;
                    puVar76 = puVar76 + 4;
                    uVar66 = uVar66 - uVar77;
                  } while (-1 < (int)uVar66);
                  local_43b0 = (undefined1 (*) [16])
                               ((long)*(undefined1 (*) [16])
                                       (L3_decode_scalefactors_g_scf_partitions +
                                       (((ulong)(uVar3 == '\0') + 1) - (ulong)(uVar4 == '\0')) *
                                       0x1c) + (uVar57 & 0xffffffff));
                  uVar66 = 0xfffffff0;
                }
                else {
                  uVar66 = (uint)local_4368->scfsi;
                  local_43b4[0] =
                       (byte)L3_decode_scalefactors_g_scfc_decode[local_4368->scalefac_compress] >>
                       2;
                  local_43b4[1] = local_43b4[0];
                  local_43b4[2] =
                       L3_decode_scalefactors_g_scfc_decode[local_4368->scalefac_compress] & 3;
                  local_43b4[3] = local_43b4[2];
                }
                local_4378 = (long)local_3fb0.pos + (ulong)uVar7;
                puVar76 = local_80 + lVar58 * 0x27;
                local_4370 = (float *)(ulong)bVar75;
                lVar58 = 0;
                __dest = &local_4338;
                do {
                  uVar57 = (ulong)*(byte *)((long)*local_43b0 + lVar58);
                  if (uVar57 == 0) break;
                  if ((uVar66 & 8) == 0) {
                    bVar54 = local_43b4[lVar58];
                    if (bVar54 == 0) {
                      memset(__dest,0,uVar57);
                      memset(puVar76,0,uVar57);
                    }
                    else {
                      uVar49 = ~(-1 << (bVar54 & 0x1f));
                      if (-1 < (int)uVar66) {
                        uVar49 = 0xffffffff;
                      }
                      uVar78 = 0;
                      do {
                        uVar48 = get_bits(&local_3fb0,(uint)bVar54);
                        uVar55 = (char)uVar48;
                        if (uVar48 == uVar49) {
                          uVar55 = 0xff;
                        }
                        *(char *)((long)__dest + uVar78) = (char)uVar48;
                        puVar76[uVar78] = uVar55;
                        uVar78 = uVar78 + 1;
                      } while (uVar57 != uVar78);
                    }
                  }
                  else {
                    memcpy(__dest,puVar76,uVar57);
                  }
                  puVar76 = puVar76 + uVar57;
                  __dest = (undefined4 *)((long)__dest + uVar57);
                  lVar58 = lVar58 + 1;
                  uVar66 = uVar66 * 2;
                  auVar122._0_12_ = ZEXT812(0x3f800000);
                  auVar122._12_4_ = 0;
                } while (lVar58 != 4);
                *(undefined1 *)((long)__dest + 2) = 0;
                *(undefined2 *)__dest = 0;
                bVar54 = local_4368->n_short_sfb;
                if ((ulong)bVar54 == 0) {
                  if (local_4368->preflag != '\0') {
                    lVar58 = 0;
                    do {
                      pcVar1 = (char *)((long)&local_4330 + lVar58 + 3);
                      *pcVar1 = *pcVar1 + (&L3_decode_scalefactors_g_preamp)[lVar58];
                      lVar58 = lVar58 + 1;
                    } while (lVar58 != 10);
                  }
                }
                else {
                  uVar3 = local_4368->subblock_gain[0];
                  bVar56 = 2 - (char)local_4370;
                  uVar4 = local_4368->subblock_gain[1];
                  uVar78 = (ulong)local_4368->n_long_sfb;
                  uVar5 = local_4368->subblock_gain[2];
                  uVar57 = 0;
                  do {
                    pcVar1 = (char *)((long)&local_4338 + uVar57 + uVar78);
                    *pcVar1 = *pcVar1 + (uVar3 << (bVar56 & 0x1f));
                    pcVar1 = (char *)((long)&local_4338 + uVar57 + uVar78 + 1);
                    *pcVar1 = *pcVar1 + (uVar4 << (bVar56 & 0x1f));
                    pcVar1 = (char *)((long)&local_4338 + uVar57 + uVar78 + 2);
                    *pcVar1 = *pcVar1 + (uVar5 << (bVar56 & 0x1f));
                    uVar57 = uVar57 + 3;
                  } while (uVar57 < bVar54);
                }
                fVar90 = 2048.0;
                uVar66 = ((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                         (uint)local_4368->global_gain) + 0x102;
                do {
                  uVar77 = 0x78;
                  if ((int)uVar66 < 0x78) {
                    uVar77 = uVar66;
                  }
                  fVar90 = fVar90 * (float)(int)(0x40000000 >> ((byte)(uVar77 >> 2) & 0x1f)) *
                                    (float)(&L3_ldexp_q2_g_expfrac)[uVar77 & 3];
                  uVar61 = uVar66 - uVar77;
                  bVar89 = (int)uVar77 <= (int)uVar66;
                  uVar66 = uVar61;
                } while (uVar61 != 0 && bVar89);
                uVar66 = (uint)bVar54 + (uint)local_4368->n_long_sfb;
                if (uVar66 != 0) {
                  uVar57 = 0;
                  do {
                    uVar77 = (uint)*(byte *)((long)&local_4338 + uVar57) << (bVar75 + 1 & 0x1f);
                    fVar93 = fVar90;
                    do {
                      uVar61 = 0x78;
                      if ((int)uVar77 < 0x78) {
                        uVar61 = uVar77;
                      }
                      fVar93 = fVar93 * (float)(int)(0x40000000 >> ((byte)(uVar61 >> 2) & 0x1f)) *
                                        (float)(&L3_ldexp_q2_g_expfrac)[uVar61 & 3];
                      uVar69 = uVar77 - uVar61;
                      bVar89 = (int)uVar61 <= (int)uVar77;
                      uVar77 = uVar69;
                    } while (uVar69 != 0 && bVar89);
                    local_2220[uVar57] = fVar93;
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar66);
                }
                pfVar70 = local_3420 + (long)local_4380 * 0x240;
                uVar66 = local_3fb0.pos + 7;
                if (-1 < local_3fb0.pos) {
                  uVar66 = local_3fb0.pos;
                }
                local_4360 = local_3fb0.buf;
                puVar79 = (uint *)((long)(local_3fb0.buf + ((int)uVar66 >> 3)) + 4);
                uVar66 = *(uint *)(local_3fb0.buf + ((int)uVar66 >> 3));
                uVar57 = (ulong)((uVar66 >> 0x18 | (uVar66 & 0xff0000) >> 8 | (uVar66 & 0xff00) << 8
                                 | uVar66 << 0x18) << ((byte)local_3fb0.pos & 7));
                uVar77 = (uint)local_4368->big_values;
                uVar66 = local_3fb0.pos | 0xfffffff8;
                pbVar88 = local_4368->sfbtab;
                if (local_4368->big_values == 0) {
                  auVar91._0_12_ = ZEXT812(0);
                  auVar91._12_4_ = 0;
                  pauVar68 = (undefined1 (*) [16])local_2220;
                }
                else {
                  uVar78 = 0;
                  pauVar68 = (undefined1 (*) [16])local_2220;
                  uVar61 = uVar77;
                  do {
                    bVar75 = local_4368->table_select[uVar78];
                    local_4370 = (float *)uVar78;
                    uVar69 = (uint)local_4368->region_count[uVar78];
                    sVar8 = *(short *)(L3_huffman_tabindex + (ulong)bVar75 * 2);
                    if (bVar75 < 0x10) {
                      do {
                        uVar73 = (uint)(*pbVar88 >> 1);
                        uVar77 = uVar73;
                        if ((int)uVar61 < (int)uVar73) {
                          uVar77 = uVar61;
                        }
                        fVar90 = *(float *)*pauVar68;
                        auVar91 = ZEXT416((uint)fVar90);
                        do {
                          pfVar53 = pfVar70;
                          uVar80 = (uint)uVar57;
                          sVar9 = *(short *)(L3_huffman_tabs +
                                            (uVar57 >> 0x1b) * 2 + (long)sVar8 * 2);
                          uVar64 = (uint)sVar9;
                          if (sVar9 < 0) {
                            uVar62 = 5;
                            do {
                              uVar80 = (int)uVar57 << (sbyte)uVar62;
                              uVar57 = (ulong)uVar80;
                              uVar66 = uVar66 + uVar62;
                              uVar62 = uVar64 & 7;
                              sVar9 = *(short *)(L3_huffman_tabs +
                                                (ulong)((uVar80 >> (-(char)uVar62 & 0x1fU)) -
                                                       ((int)uVar64 >> 3)) * 2 + (long)sVar8 * 2);
                              uVar64 = (uint)sVar9;
                            } while (sVar9 < 0);
                          }
                          uVar57 = (ulong)(uVar80 << ((byte)(uVar64 >> 8) & 0x1f));
                          uVar66 = (uVar64 >> 8) + uVar66;
                          lVar58 = 0;
                          do {
                            uVar80 = uVar64 & 0xf;
                            *(float *)((long)pfVar53 + lVar58) =
                                 g_pow43[((uint)(uVar57 >> 0x1b) & 0x10 | uVar80) ^ 0x10] * fVar90;
                            uVar57 = (ulong)(uint)((int)uVar57 << (uVar80 != 0));
                            uVar66 = uVar66 + (uVar80 != 0);
                            uVar64 = uVar64 >> 4;
                            lVar58 = lVar58 + 4;
                          } while ((int)lVar58 == 4);
                          uVar64 = uVar66;
                          if (-1 < (int)uVar66) {
                            do {
                              uVar66 = *puVar79;
                              puVar79 = (uint *)((long)puVar79 + 1);
                              uVar57 = (ulong)((uint)uVar57 |
                                              (uint)(byte)uVar66 << ((byte)uVar64 & 0x1f));
                              uVar66 = uVar64 - 8;
                              bVar89 = 7 < (int)uVar64;
                              uVar64 = uVar66;
                            } while (bVar89);
                          }
                          uVar77 = uVar77 - 1;
                          pfVar70 = (float *)((long)pfVar53 + lVar58);
                        } while (uVar77 != 0);
                        pbVar88 = pbVar88 + 1;
                        pauVar68 = (undefined1 (*) [16])((long)*pauVar68 + 4);
                        uVar77 = uVar61 - uVar73;
                        if (uVar77 == 0 || (int)uVar61 < (int)uVar73) break;
                        pfVar70 = (float *)((long)pfVar53 + lVar58);
                        bVar89 = 0 < (int)uVar69;
                        uVar61 = uVar77;
                        uVar69 = uVar69 - 1;
                      } while (bVar89);
                      pfVar70 = (float *)((long)pfVar53 + lVar58);
                    }
                    else {
                      bVar75 = L3_huffman_g_linbits[bVar75];
                      do {
                        uVar73 = (uint)(*pbVar88 >> 1);
                        uVar77 = uVar73;
                        if ((int)uVar61 < (int)uVar73) {
                          uVar77 = uVar61;
                        }
                        local_43b0 = pauVar68;
                        fVar90 = *(float *)*pauVar68;
                        auVar91 = ZEXT416((uint)fVar90);
                        do {
                          uVar64 = (uint)uVar57;
                          sVar9 = *(short *)(L3_huffman_tabs +
                                            (uVar57 >> 0x1b) * 2 + (long)sVar8 * 2);
                          uVar80 = (uint)sVar9;
                          if (sVar9 < 0) {
                            uVar62 = 5;
                            do {
                              uVar64 = (int)uVar57 << (sbyte)uVar62;
                              uVar57 = (ulong)uVar64;
                              uVar66 = uVar66 + uVar62;
                              uVar62 = uVar80 & 7;
                              sVar9 = *(short *)(L3_huffman_tabs +
                                                (ulong)((uVar64 >> (-(char)uVar62 & 0x1fU)) -
                                                       ((int)uVar80 >> 3)) * 2 + (long)sVar8 * 2);
                              uVar80 = (uint)sVar9;
                            } while (sVar9 < 0);
                          }
                          uVar57 = (ulong)(uVar64 << ((byte)(uVar80 >> 8) & 0x1f));
                          uVar66 = (uVar80 >> 8) + uVar66;
                          iVar45 = 0;
                          do {
                            uVar64 = uVar80 & 0xf;
                            uVar62 = (uint)uVar57;
                            if (uVar64 == 0xf) {
                              uVar67 = uVar62 >> (0x20 - bVar75 & 0x1f);
                              uVar62 = uVar62 << (bVar75 & 0x1f);
                              uVar66 = uVar66 + bVar75;
                              uVar64 = uVar66;
                              if (-1 < (int)uVar66) {
                                do {
                                  uVar66 = *puVar79;
                                  puVar79 = (uint *)((long)puVar79 + 1);
                                  uVar62 = uVar62 | (uint)(byte)uVar66 << ((byte)uVar64 & 0x1f);
                                  uVar66 = uVar64 - 8;
                                  bVar89 = 7 < (int)uVar64;
                                  uVar64 = uVar66;
                                } while (bVar89);
                              }
                              uVar64 = uVar67 + 0xf;
                              if ((int)uVar64 < 0x81) {
                                fVar93 = g_pow43[(int)(uVar67 + 0x1f)];
                              }
                              else {
                                uVar33 = uVar64 * 8;
                                if (SBORROW4(uVar64,0x400) == (int)(uVar67 - 0x3f1) < 0) {
                                  uVar33 = uVar64;
                                }
                                uVar67 = uVar33 * 2 & 0x40;
                                fVar93 = (float)(int)((uVar33 & 0x3f) - uVar67) /
                                         (float)(int)((uVar33 & 0x7fffffc0) + uVar67);
                                fVar93 = ((fVar93 * 0.22222222 + 1.3333334) * fVar93 +
                                         auVar122._0_4_) *
                                         g_pow43[(ulong)(uVar67 + uVar33 >> 6) + 0x10] *
                                         *(float *)(&DAT_00108208 + (ulong)((int)uVar64 < 0x400) * 4
                                                   );
                              }
                              fVar93 = (float)(int)((int)uVar62 >> 0x1f | 1) * fVar93 * fVar90;
                            }
                            else {
                              fVar93 = g_pow43[((uint)(uVar57 >> 0x1b) & 0x10 | uVar64) ^ 0x10] *
                                       fVar90;
                            }
                            uVar57 = (ulong)(uVar62 << (uVar64 != 0));
                            *pfVar70 = fVar93;
                            uVar66 = uVar66 + (uVar64 != 0);
                            pfVar70 = pfVar70 + 1;
                            uVar80 = uVar80 >> 4;
                            bVar89 = iVar45 == 0;
                            iVar45 = iVar45 + 1;
                          } while (bVar89);
                          uVar64 = uVar66;
                          if (-1 < (int)uVar66) {
                            do {
                              uVar66 = *puVar79;
                              puVar79 = (uint *)((long)puVar79 + 1);
                              uVar57 = (ulong)((uint)uVar57 |
                                              (uint)(byte)uVar66 << ((byte)uVar64 & 0x1f));
                              uVar66 = uVar64 - 8;
                              bVar89 = 7 < (int)uVar64;
                              uVar64 = uVar66;
                            } while (bVar89);
                          }
                          uVar77 = uVar77 - 1;
                        } while (uVar77 != 0);
                        pbVar88 = pbVar88 + 1;
                        pauVar68 = (undefined1 (*) [16])((long)*pauVar68 + 4);
                        uVar77 = uVar61 - uVar73;
                      } while ((uVar77 != 0 && (int)uVar73 <= (int)uVar61) &&
                              (bVar89 = 0 < (int)uVar69, uVar61 = uVar77, uVar69 = uVar69 - 1,
                              bVar89));
                    }
                    uVar78 = uVar78 + 1;
                    uVar61 = uVar77;
                  } while (0 < (int)uVar77);
                }
                uVar77 = 1 - uVar77;
                puVar76 = L3_huffman_tab33;
                if (local_4368->count1_table == '\0') {
                  puVar76 = L3_huffman_tab32;
                }
                do {
                  bVar75 = puVar76[uVar57 >> 0x1c];
                  if ((bVar75 & 8) == 0) {
                    bVar75 = puVar76[(ulong)((uint)((int)uVar57 << 4) >> (-(bVar75 & 3) & 0x1f)) +
                                     (ulong)(bVar75 >> 3)];
                  }
                  uVar61 = bVar75 & 7;
                  uVar69 = (int)uVar57 << (sbyte)uVar61;
                  uVar57 = (ulong)uVar69;
                  uVar66 = uVar61 + uVar66;
                  if ((long)local_4378 <
                      (long)(int)uVar66 + ((long)puVar79 - (long)local_3fb0.buf) * 8 + -0x18) {
LAB_001020bb:
                    bVar89 = false;
                  }
                  else {
                    uVar77 = uVar77 - 1;
                    if (uVar77 == 0) {
                      bVar54 = *pbVar88;
                      pbVar88 = pbVar88 + 1;
                      uVar77 = 0;
                      if (bVar54 < 2) goto LAB_001020bb;
                      auVar91 = ZEXT416((uint)*(float *)*pauVar68);
                      pauVar68 = (undefined1 (*) [16])((long)*pauVar68 + 4);
                      uVar77 = (uint)(bVar54 >> 1);
                    }
                    if (0x7f < bVar75) {
                      auVar95 = auVar91;
                      if ((int)uVar69 < 0) {
                        auVar95._0_4_ = auVar91._0_4_ ^ 0x80000000;
                        auVar95._4_4_ = 0;
                        auVar95._8_4_ = auVar91._8_4_ ^ 0x80000000;
                        auVar95._12_4_ = auVar91._12_4_ ^ 0x80000000;
                      }
                      *pfVar70 = auVar95._0_4_;
                      uVar57 = (ulong)(uVar69 * 2);
                      uVar66 = uVar66 + 1;
                    }
                    if ((bVar75 & 0x40) != 0) {
                      auVar96 = auVar91;
                      if ((int)uVar57 < 0) {
                        auVar96._0_4_ = auVar91._0_4_ ^ 0x80000000;
                        auVar96._4_4_ = 0;
                        auVar96._8_4_ = auVar91._8_4_ ^ 0x80000000;
                        auVar96._12_4_ = auVar91._12_4_ ^ 0x80000000;
                      }
                      pfVar70[1] = auVar96._0_4_;
                      uVar57 = (ulong)(uint)((int)uVar57 * 2);
                      uVar66 = uVar66 + 1;
                    }
                    uVar77 = uVar77 - 1;
                    if (uVar77 == 0) {
                      bVar54 = *pbVar88;
                      pbVar88 = pbVar88 + 1;
                      uVar77 = 0;
                      if (bVar54 < 2) goto LAB_001020bb;
                      auVar91 = ZEXT416((uint)*(float *)*pauVar68);
                      pauVar68 = (undefined1 (*) [16])((long)*pauVar68 + 4);
                      uVar77 = (uint)(bVar54 >> 1);
                    }
                    if ((bVar75 & 0x20) != 0) {
                      auVar97 = auVar91;
                      if ((int)uVar57 < 0) {
                        auVar97._0_4_ = auVar91._0_4_ ^ 0x80000000;
                        auVar97._4_4_ = 0;
                        auVar97._8_4_ = auVar91._8_4_ ^ 0x80000000;
                        auVar97._12_4_ = auVar91._12_4_ ^ 0x80000000;
                      }
                      pfVar70[2] = auVar97._0_4_;
                      uVar57 = (ulong)(uint)((int)uVar57 * 2);
                      uVar66 = uVar66 + 1;
                    }
                    if ((bVar75 & 0x10) != 0) {
                      auVar98 = auVar91;
                      if ((int)uVar57 < 0) {
                        auVar98._0_4_ = auVar91._0_4_ ^ 0x80000000;
                        auVar98._4_4_ = 0;
                        auVar98._8_4_ = auVar91._8_4_ ^ 0x80000000;
                        auVar98._12_4_ = auVar91._12_4_ ^ 0x80000000;
                      }
                      pfVar70[3] = auVar98._0_4_;
                      uVar57 = (ulong)(uint)((int)uVar57 * 2);
                      uVar66 = uVar66 + 1;
                    }
                    bVar89 = true;
                    uVar61 = uVar66;
                    if (-1 < (int)uVar66) {
                      do {
                        uVar66 = *puVar79;
                        puVar79 = (uint *)((long)puVar79 + 1);
                        uVar57 = (ulong)((uint)uVar57 | (uint)(byte)uVar66 << ((byte)uVar61 & 0x1f))
                        ;
                        uVar66 = uVar61 - 8;
                        bVar11 = 7 < (int)uVar61;
                        uVar61 = uVar66;
                      } while (bVar11);
                    }
                  }
                  pfVar70 = pfVar70 + 4;
                } while (bVar89);
                local_3fb0.pos = (uint)local_4378;
                lVar58 = (long)local_4380 + 1;
              } while (lVar58 != local_4358);
            }
            bVar75 = dec->header[3];
            if ((bVar75 & 0x10) == 0) {
              if ((bVar75 & 0xe0) == 0x60) {
                uVar57 = 0xfffffffffffffffc;
                do {
                  fVar90 = afStack_3410[uVar57];
                  fVar93 = afStack_3410[uVar57 + 1];
                  fVar94 = afStack_3410[uVar57 + 2];
                  fVar34 = afStack_3410[uVar57 + 3];
                  auVar92 = *(undefined1 (*) [16])(afStack_2b10 + uVar57);
                  auVar111._0_4_ = fVar90 + auVar92._0_4_;
                  auVar111._4_4_ = fVar93 + auVar92._4_4_;
                  auVar111._8_4_ = fVar94 + auVar92._8_4_;
                  auVar111._12_4_ = fVar34 + auVar92._12_4_;
                  *(undefined1 (*) [16])(afStack_3410 + uVar57) = auVar111;
                  afStack_2b10[uVar57] = fVar90 - auVar92._0_4_;
                  afStack_2b10[uVar57 + 1] = fVar93 - auVar92._4_4_;
                  afStack_2b10[uVar57 + 2] = fVar94 - auVar92._8_4_;
                  local_2220[uVar57 - 0x239] = fVar34 - auVar92._12_4_;
                  uVar57 = uVar57 + 4;
                } while (uVar57 < 0x239);
              }
            }
            else {
              bVar54 = local_4398->n_long_sfb;
              bVar56 = local_4398->n_short_sfb;
              puVar50 = local_4398->sfbtab;
              local_4330 = -NAN;
              _local_4338 = 0xffffffffffffffff;
              uVar66 = (uint)bVar56 + (uint)bVar54;
              if (uVar66 != 0) {
                uVar57 = 0;
                puVar76 = local_2b20;
                do {
                  uVar78 = (ulong)puVar50[uVar57];
                  if (uVar78 != 0) {
                    uVar86 = 0;
                    do {
                      if (((*(float *)(puVar76 + uVar86 * 4) != 0.0) ||
                          (*(float *)(puVar76 + uVar86 * 4 + 4) != 0.0)) ||
                         (NAN(*(float *)(puVar76 + uVar86 * 4 + 4)))) {
                        (&local_4338)[(uint)((int)uVar57 + (int)((uVar57 & 0xffffffff) / 3) * -3)] =
                             (int)uVar57;
                        break;
                      }
                      uVar86 = uVar86 + 2;
                    } while (uVar86 < uVar78);
                  }
                  puVar76 = puVar76 + uVar78 * 4;
                  uVar57 = uVar57 + 1;
                } while (uVar57 != uVar66);
              }
              if (bVar54 != 0) {
                if ((int)fStack_4334 < (int)local_4338) {
                  fStack_4334 = local_4338;
                }
                if ((int)fStack_4334 <= (int)local_4330) {
                  fStack_4334 = local_4330;
                }
                local_4330 = fStack_4334;
                _local_4338 = CONCAT44(fStack_4334,fStack_4334);
              }
              uVar77 = (uint)(bVar56 != 0) * 2 + 1;
              lVar58 = (long)(int)(uVar66 - uVar77) + -0x59;
              uVar57 = 0;
              do {
                if ((int)(&local_4338)[uVar57] < (int)(uVar66 + uVar77 * -2 + (int)uVar57)) {
                  bVar54 = local_59[uVar57 + (lVar58 - (ulong)uVar77) + 0x59];
                }
                else {
                  bVar54 = (char)(dec->header[1] << 4) >> 7 & 3;
                }
                local_59[uVar57 + lVar58 + 0x59] = bVar54;
                uVar57 = uVar57 + 1;
              } while (uVar57 != uVar77);
              pbVar88 = local_4398->sfbtab;
              bVar54 = dec->header[1];
              bVar56 = 7;
              if ((bVar54 & 8) == 0) {
                bVar56 = 0x40;
              }
              bVar82 = *pbVar88;
              if (bVar82 != 0) {
                uVar10 = local_4398[1].scalefac_compress;
                fVar90 = *(float *)(&DAT_00108210 + (ulong)((bVar75 & 0x20) == 0) * 4);
                uVar57 = 0;
                pfVar70 = local_3420;
                do {
                  iVar45 = (int)uVar57;
                  if ((int)(&local_4338)[(uint)(iVar45 + (int)(uVar57 / 3) * -3)] < iVar45) {
                    bVar6 = local_59[uVar57];
                    if (bVar56 <= bVar6) goto LAB_0010248e;
                    if ((bVar54 & 8) == 0) {
                      auVar99 = auVar122;
                      uVar66 = (bVar6 + 1 >> 1) << ((byte)uVar10 & 1);
                      do {
                        auVar92 = auVar99;
                        uVar78 = 0x78;
                        if ((int)uVar66 < 0x78) {
                          uVar78 = (ulong)uVar66;
                        }
                        uVar61 = (uint)uVar78;
                        auVar99._4_12_ = auVar92._4_12_;
                        auVar99._0_4_ =
                             auVar92._0_4_ *
                             (float)(int)(0x40000000 >> ((byte)(uVar78 >> 2) & 0x1f)) *
                             (float)(&L3_ldexp_q2_g_expfrac)[uVar61 & 3];
                        uVar77 = uVar66 - uVar61;
                        bVar89 = (int)uVar61 <= (int)uVar66;
                        uVar66 = uVar77;
                      } while (uVar77 != 0 && bVar89);
                      auVar112 = auVar122;
                      if ((bVar6 & 1) != 0) {
                        auVar112._4_4_ = 0;
                        auVar112._0_4_ = auVar99._0_4_;
                        auVar112._8_4_ = auVar92._8_4_;
                        auVar112._12_4_ = auVar92._12_4_;
                        auVar99 = auVar122;
                      }
                      fVar94 = auVar99._0_4_;
                      fVar93 = auVar112._0_4_;
                    }
                    else {
                      fVar93 = *(float *)(L3_stereo_process_g_pan + (ulong)bVar6 * 8);
                      fVar94 = *(float *)(L3_stereo_process_g_pan + (ulong)bVar6 * 8 + 4);
                    }
                    uVar78 = 0;
                    do {
                      pfVar70[uVar78 + 0x240] = fVar94 * fVar90 * pfVar70[uVar78];
                      pfVar70[uVar78] = pfVar70[uVar78] * fVar93 * fVar90;
                      uVar78 = uVar78 + 1;
                    } while (bVar82 != uVar78);
                  }
                  else {
LAB_0010248e:
                    if ((bVar75 & 0x20) != 0) {
                      uVar78 = 0;
                      if (3 < bVar82) {
                        uVar78 = 0;
                        do {
                          pfVar53 = pfVar70 + uVar78;
                          fVar93 = *pfVar53;
                          fVar94 = pfVar53[1];
                          fVar34 = pfVar53[2];
                          fVar35 = pfVar53[3];
                          auVar92 = *(undefined1 (*) [16])(pfVar70 + uVar78 + 0x240);
                          pfVar53 = pfVar70 + uVar78;
                          *pfVar53 = fVar93 + auVar92._0_4_;
                          pfVar53[1] = fVar94 + auVar92._4_4_;
                          pfVar53[2] = fVar34 + auVar92._8_4_;
                          pfVar53[3] = fVar35 + auVar92._12_4_;
                          auVar100._0_4_ = fVar93 - auVar92._0_4_;
                          auVar100._4_4_ = fVar94 - auVar92._4_4_;
                          auVar100._8_4_ = fVar34 - auVar92._8_4_;
                          auVar100._12_4_ = fVar35 - auVar92._12_4_;
                          *(undefined1 (*) [16])(pfVar70 + uVar78 + 0x240) = auVar100;
                          uVar78 = uVar78 + 4;
                        } while ((long)uVar78 < (long)(int)(bVar82 - 3));
                      }
                      if ((int)uVar78 < (int)(uint)bVar82) {
                        uVar78 = uVar78 & 0xffffffff;
                        do {
                          fVar93 = pfVar70[uVar78];
                          pfVar70[uVar78] = fVar93 + pfVar70[uVar78 + 0x240];
                          pfVar70[uVar78 + 0x240] = fVar93 - pfVar70[uVar78 + 0x240];
                          uVar78 = uVar78 + 1;
                        } while (bVar82 != uVar78);
                      }
                    }
                  }
                  pfVar70 = pfVar70 + pbVar88[uVar57];
                  uVar57 = (ulong)(iVar45 + 1);
                  bVar82 = pbVar88[uVar57];
                } while (bVar82 != 0);
              }
            }
            pbVar84 = &local_3fb0;
            if (0 < (int)local_4358) {
              puVar76 = local_33d4;
              pauVar68 = (undefined1 (*) [16])local_33e8;
              lVar58 = 0;
              pLVar83 = local_4398;
              do {
                uVar3 = pLVar83->mixed_block_flag;
                iVar45 = (uint)(uVar3 != '\0') * 2 <<
                         ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) *
                                 '\x03' + (dec->header[2] >> 2 & 3)) == '\x02');
                if (pLVar83->n_short_sfb == '\0') {
                  iVar47 = 0x1f;
                }
                else {
                  __dest_00 = (void *)((long)local_3420 +
                                      (ulong)(uint)(iVar45 * 0x48) + lVar58 * 0x900);
                  bVar75 = pLVar83->sfbtab[pLVar83->n_long_sfb];
                  pfVar70 = local_2180;
                  if (bVar75 != 0) {
                    puVar50 = pLVar83->sfbtab + pLVar83->n_long_sfb;
                    pvVar71 = __dest_00;
                    do {
                      uVar57 = (ulong)bVar75;
                      lVar81 = 0;
                      do {
                        *pfVar70 = *(float *)((long)pvVar71 + lVar81);
                        pfVar70[1] = *(float *)((long)pvVar71 + lVar81 + uVar57 * 4);
                        pfVar70[2] = *(float *)((long)pvVar71 + lVar81 + uVar57 * 8);
                        pfVar70 = pfVar70 + 3;
                        lVar81 = lVar81 + 4;
                      } while (((uint)bVar75 + (uint)(uVar57 == 0)) * 4 != (int)lVar81);
                      pvVar71 = (void *)((long)pvVar71 + lVar81 + uVar57 * 8);
                      bVar75 = puVar50[3];
                      puVar50 = puVar50 + 3;
                    } while (bVar75 != 0);
                  }
                  iVar47 = iVar45 + -1;
                  memcpy(__dest_00,local_2180,(long)pfVar70 - (long)local_2180);
                }
                pbVar51 = pbVar84;
                pauVar59 = pauVar68;
                if (0 < iVar47) {
                  do {
                    lVar81 = 0;
                    pauVar63 = pauVar59;
                    do {
                      piVar2 = &pbVar51[0xbd].pos + lVar81;
                      fVar90 = (float)*piVar2;
                      fVar93 = (float)piVar2[1];
                      fVar94 = (float)piVar2[2];
                      fVar34 = (float)piVar2[3];
                      fVar35 = *(float *)*pauVar63;
                      fVar36 = *(float *)((long)*pauVar63 + 4);
                      fVar37 = *(float *)((long)*pauVar63 + 8);
                      fVar38 = *(float *)((long)*pauVar63 + 0xc);
                      auVar92 = *(undefined1 (*) [16])(L3_antialias_g_aa + lVar81 * 4);
                      lVar60 = lVar81 * 4;
                      fVar39 = *(float *)(L3_antialias_g_aa + lVar60 + 0x20);
                      fVar40 = *(float *)(L3_antialias_g_aa + lVar60 + 0x24);
                      fVar41 = *(float *)(L3_antialias_g_aa + lVar60 + 0x28);
                      fVar42 = *(float *)(L3_antialias_g_aa + lVar60 + 0x2c);
                      piVar2 = &pbVar51[0xbd].pos + lVar81;
                      *piVar2 = (int)(fVar90 * auVar92._0_4_ - fVar38 * fVar39);
                      piVar2[1] = (int)(fVar93 * auVar92._4_4_ - fVar37 * fVar40);
                      piVar2[2] = (int)(fVar94 * auVar92._8_4_ - fVar36 * fVar41);
                      piVar2[3] = (int)(fVar34 * auVar92._12_4_ - fVar35 * fVar42);
                      auVar101._4_4_ = fVar36 * auVar92._8_4_ + fVar94 * fVar41;
                      auVar101._0_4_ = fVar35 * auVar92._12_4_ + fVar34 * fVar42;
                      auVar101._8_4_ = fVar37 * auVar92._4_4_ + fVar93 * fVar40;
                      auVar101._12_4_ = fVar38 * auVar92._0_4_ + fVar90 * fVar39;
                      *pauVar63 = auVar101;
                      lVar81 = lVar81 + 4;
                      pauVar63 = pauVar63 + -1;
                    } while (lVar81 == 4);
                    bVar89 = 1 < iVar47;
                    pbVar51 = (bs_t *)&pbVar51[4].pos;
                    pauVar59 = (undefined1 (*) [16])((long)pauVar59[4] + 8);
                    iVar47 = iVar47 + -1;
                  } while (bVar89);
                }
                local_43b0 = pauVar68;
                pfVar70 = local_3420 + lVar58 * 0x240;
                overlap = dec->mdct_overlap + lVar58;
                uVar4 = pLVar83->block_type;
                if (uVar3 != '\0') {
                  L3_imdct36(pfVar70,*overlap,(float *)L3_imdct_gr_g_mdct_window,iVar45);
                  pfVar70 = (float *)((long)pfVar70 + (ulong)(uint)(iVar45 * 0x48));
                  overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar45 * 0x24));
                }
                local_4398 = pLVar83;
                if (uVar4 == '\x02') {
                  iVar45 = 0x21 - iVar45;
                  lVar81 = 0;
                  do {
                    pfVar53 = (float *)((long)pfVar70 + lVar81 * 2);
                    pfVar72 = pfVar53;
                    pfVar74 = (float *)&local_4338;
                    for (lVar60 = 0x12; lVar60 != 0; lVar60 = lVar60 + -1) {
                      *pfVar74 = *pfVar72;
                      pfVar72 = pfVar72 + (ulong)bVar44 * -2 + 1;
                      pfVar74 = pfVar74 + (ulong)bVar44 * -2 + 1;
                    }
                    pfVar72 = (float *)((long)*overlap + lVar81 + 0x18);
                    *(undefined8 *)(pfVar53 + 4) = *(undefined8 *)(pfVar72 + -2);
                    uVar43 = *(undefined8 *)(pfVar72 + -4);
                    *(undefined8 *)pfVar53 = *(undefined8 *)(pfVar72 + -6);
                    *(undefined8 *)(pfVar53 + 2) = uVar43;
                    L3_imdct12((float *)&local_4338,(float *)((long)pfVar70 + lVar81 * 2 + 0x18),
                               pfVar72);
                    L3_imdct12(&fStack_4334,(float *)((long)pfVar70 + lVar81 * 2 + 0x30),pfVar72);
                    L3_imdct12((float *)&local_4330,(float *)((long)*overlap + lVar81),pfVar72);
                    iVar45 = iVar45 + -1;
                    lVar81 = lVar81 + 0x24;
                  } while (1 < iVar45);
                }
                else {
                  L3_imdct36(pfVar70,*overlap,
                             (float *)(L3_imdct_gr_g_mdct_window + (ulong)(uVar4 == '\x03') * 0x48),
                             0x20 - iVar45);
                }
                puVar52 = puVar76;
                uVar66 = 0;
                do {
                  uVar57 = 0xffffffffffffffff;
                  do {
                    *(uint *)(puVar52 + uVar57 * 4 + 4) =
                         *(uint *)(puVar52 + uVar57 * 4 + 4) ^ (uint)DAT_00108090;
                    uVar57 = uVar57 + 2;
                  } while (uVar57 < 0x10);
                  puVar52 = puVar52 + 0x90;
                  bVar89 = uVar66 < 0x1e;
                  uVar66 = uVar66 + 2;
                } while (bVar89);
                lVar58 = lVar58 + 1;
                pLVar83 = local_4398 + 1;
                pauVar68 = local_43b0 + 0x90;
                pbVar84 = pbVar84 + 0x90;
                puVar76 = puVar76 + 0x900;
              } while (lVar58 != local_4358);
            }
            pmVar65 = local_4388;
            pmVar85 = local_4390;
            mp3d_synth_granule(local_4350,local_3420,0x12,local_4388->channels,local_4390,local_2180
                              );
            if ((local_4348[1] & 8) == 0) break;
            pmVar85 = pmVar85 + (long)pmVar65->channels * 0x240;
            uVar78 = (ulong)((int)local_4340 + 1);
          } while ((int)local_4340 == 0);
        }
        uVar66 = local_3fb0.pos + 7U >> 3;
        uVar61 = ((uint)local_3fb0.limit >> 3) - uVar66;
        uVar77 = 0x1ff;
        if ((int)uVar61 < 0x1ff) {
          uVar77 = uVar61;
        }
        if (0 < (int)uVar61) {
          if (0x1ff < (int)uVar61) {
            uVar66 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
          }
          memcpy(dec->reserv_buf,local_3fa0 + uVar66,(ulong)uVar77);
        }
        uVar66 = (uint)(iVar46 <= iVar127);
        dec->reserv = uVar77;
        bVar89 = true;
      }
      if (!bVar89) {
        return 0;
      }
    }
    else {
      bVar44 = puVar50[3] >> 6;
      if (bVar44 == 3) {
        uVar66 = 0;
      }
      else if (bVar44 == 1) {
        uVar66 = (puVar50[3] >> 2 & 0xc) + 4;
      }
      else {
        uVar66 = 0x20;
      }
      if ((~bVar75 & 6) == 0) {
        puVar76 = &L12_subband_alloc_table_g_alloc_L1;
        uVar61 = 0x20;
      }
      else if ((bVar75 & 8) == 0) {
        puVar76 = &L12_subband_alloc_table_g_alloc_L2M2;
        uVar61 = 0x1e;
      }
      else {
        bVar56 = puVar50[2] >> 2 & 3;
        bVar54 = *(byte *)((ulong)(puVar50[2] >> 4) +
                          (long)(int)((bVar75 >> 1 & 3) - 1) * 0xf + 0x10828d);
        uVar77 = 0xc0;
        if (bVar54 != 0) {
          uVar77 = (uint)bVar54 + (uint)bVar54 >> (bVar44 != 3);
        }
        if (uVar77 < 0x38) {
          uVar61 = (uint)(bVar56 == 2) * 4 + 8;
          puVar76 = (undefined1 *)&L12_subband_alloc_table_g_alloc_L2M1_lowrate;
        }
        else {
          uVar61 = 0x1b;
          if (bVar56 != 1) {
            uVar61 = (uint)(0x5f < uVar77) * 3 + 0x1b;
          }
          puVar76 = L12_subband_alloc_table_g_alloc_L2M1;
        }
      }
      local_43d8 = local_4036;
      local_4038 = (byte)uVar61;
      uVar77 = uVar61;
      if (uVar66 < uVar61) {
        uVar77 = uVar66;
      }
      uVar86 = (ulong)uVar77;
      local_4037 = (byte)uVar77;
      uVar78 = 0;
      puVar52 = L12_read_scale_info_g_bitalloc_code_tab;
      uVar69 = 0;
      uVar57 = 0;
      do {
        if (uVar78 == uVar57) {
          uVar57 = (ulong)((int)uVar57 + (uint)(byte)puVar76[2]);
          uVar69 = (uint)(byte)puVar76[1];
          puVar52 = L12_read_scale_info_g_bitalloc_code_tab + (byte)*puVar76;
          puVar76 = puVar76 + 3;
        }
        uVar49 = get_bits(&local_43a8,uVar69);
        bVar44 = puVar52[uVar49];
        local_4036[uVar78 * 2] = bVar44;
        if (uVar78 < uVar86) {
          uVar49 = get_bits(&local_43a8,uVar69);
          bVar44 = puVar52[uVar49];
        }
        if (uVar66 == 0) {
          bVar44 = 0;
        }
        local_4036[uVar78 * 2 + 1] = bVar44;
        uVar78 = uVar78 + 1;
      } while (uVar61 != uVar78);
      uVar57 = 0;
      do {
        bVar44 = (local_4036[uVar57] == 0) << 2 | 2;
        if ((local_4036[uVar57] != 0) && ((bVar75 & 6) != 6)) {
          uVar49 = get_bits(&local_43a8,2);
          bVar44 = (byte)uVar49;
        }
        abStack_3ff6[uVar57] = bVar44;
        uVar57 = uVar57 + 1;
      } while (uVar61 * 2 != uVar57);
      pfVar70 = (float *)&local_4338;
      uVar57 = 0;
      local_43b0 = (undefined1 (*) [16])(ulong)(uVar61 * 2);
      do {
        bVar44 = *local_43d8;
        uVar66 = 0;
        if (bVar44 != 0) {
          uVar66 = 0x13U >> (abStack_3ff6[uVar57] & 0x1f) | 4;
        }
        local_43d8 = local_43d8 + 1;
        fVar90 = 0.0;
        uVar69 = 4;
        do {
          if ((uVar69 & uVar66) != 0) {
            uVar49 = get_bits(&local_43a8,6);
            fVar90 = (float)(int)(0x200000 >> ((byte)((int)uVar49 / 3) & 0x1f)) *
                     *(float *)(L12_read_scalefactors_g_deq_L12 +
                               (long)(int)((int)uVar49 % 3 + (uint)bVar44 + (uint)bVar44 * 2 + -6) *
                               4);
          }
          *pfVar70 = fVar90;
          pfVar70 = pfVar70 + 1;
          bVar89 = 1 < uVar69;
          uVar69 = uVar69 >> 1;
        } while (bVar89);
        uVar57 = uVar57 + 1;
      } while ((undefined1 (*) [16])uVar57 != local_43b0);
      if (uVar77 < uVar61) {
        lVar81 = uVar61 - uVar86;
        lVar58 = lVar81 + -1;
        auVar92._8_4_ = (int)lVar58;
        auVar92._0_8_ = lVar58;
        auVar92._12_4_ = (int)((ulong)lVar58 >> 0x20);
        lVar58 = uVar86 * 2;
        uVar57 = 0;
        do {
          auVar123._8_4_ = (int)uVar57;
          auVar123._0_8_ = uVar57;
          auVar123._12_4_ = (int)(uVar57 >> 0x20);
          auVar125 = auVar92 ^ _DAT_00108090;
          auVar128 = (auVar123 | _DAT_00108080) ^ _DAT_00108090;
          iVar45 = auVar125._0_4_;
          iVar141 = -(uint)(iVar45 < auVar128._0_4_);
          iVar46 = auVar125._4_4_;
          auVar130._4_4_ = -(uint)(iVar46 < auVar128._4_4_);
          iVar47 = auVar125._8_4_;
          iVar145 = -(uint)(iVar47 < auVar128._8_4_);
          iVar127 = auVar125._12_4_;
          auVar130._12_4_ = -(uint)(iVar127 < auVar128._12_4_);
          auVar102._4_4_ = iVar141;
          auVar102._0_4_ = iVar141;
          auVar102._8_4_ = iVar145;
          auVar102._12_4_ = iVar145;
          auVar102 = pshuflw(in_XMM1,auVar102,0xe8);
          auVar129._4_4_ = -(uint)(auVar128._4_4_ == iVar46);
          auVar129._12_4_ = -(uint)(auVar128._12_4_ == iVar127);
          auVar129._0_4_ = auVar129._4_4_;
          auVar129._8_4_ = auVar129._12_4_;
          auVar113 = pshuflw(in_XMM2,auVar129,0xe8);
          auVar130._0_4_ = auVar130._4_4_;
          auVar130._8_4_ = auVar130._12_4_;
          auVar128 = pshuflw(auVar102,auVar130,0xe8);
          auVar125._8_4_ = 0xffffffff;
          auVar125._0_8_ = 0xffffffffffffffff;
          auVar125._12_4_ = 0xffffffff;
          auVar125 = (auVar128 | auVar113 & auVar102) ^ auVar125;
          auVar125 = packssdw(auVar125,auVar125);
          if ((auVar125 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 1] = 0;
          }
          auVar113._4_4_ = iVar141;
          auVar113._0_4_ = iVar141;
          auVar113._8_4_ = iVar145;
          auVar113._12_4_ = iVar145;
          auVar130 = auVar129 & auVar113 | auVar130;
          auVar125 = packssdw(auVar130,auVar130);
          auVar128._8_4_ = 0xffffffff;
          auVar128._0_8_ = 0xffffffffffffffff;
          auVar128._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 ^ auVar128,auVar125 ^ auVar128);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._0_4_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 3] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108070) ^ _DAT_00108090;
          auVar114._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar114._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar114._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar114._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar131._4_4_ = auVar114._0_4_;
          auVar131._0_4_ = auVar114._0_4_;
          auVar131._8_4_ = auVar114._8_4_;
          auVar131._12_4_ = auVar114._8_4_;
          iVar141 = -(uint)(auVar125._4_4_ == iVar46);
          iVar145 = -(uint)(auVar125._12_4_ == iVar127);
          auVar21._4_4_ = iVar141;
          auVar21._0_4_ = iVar141;
          auVar21._8_4_ = iVar145;
          auVar21._12_4_ = iVar145;
          auVar142._4_4_ = auVar114._4_4_;
          auVar142._0_4_ = auVar114._4_4_;
          auVar142._8_4_ = auVar114._12_4_;
          auVar142._12_4_ = auVar114._12_4_;
          auVar125 = auVar21 & auVar131 | auVar142;
          auVar125 = packssdw(auVar125,auVar125);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 ^ auVar12,auVar125 ^ auVar12);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._0_4_ >> 0x10 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 5] = 0;
          }
          auVar125 = pshufhw(auVar125,auVar131,0x84);
          auVar22._4_4_ = iVar141;
          auVar22._0_4_ = iVar141;
          auVar22._8_4_ = iVar145;
          auVar22._12_4_ = iVar145;
          auVar128 = pshufhw(auVar114,auVar22,0x84);
          auVar102 = pshufhw(auVar125,auVar142,0x84);
          auVar103._8_4_ = 0xffffffff;
          auVar103._0_8_ = 0xffffffffffffffff;
          auVar103._12_4_ = 0xffffffff;
          auVar103 = (auVar102 | auVar128 & auVar125) ^ auVar103;
          auVar125 = packssdw(auVar103,auVar103);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._0_4_ >> 0x18 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 7] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108060) ^ _DAT_00108090;
          auVar115._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar115._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar115._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar115._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar23._4_4_ = auVar115._0_4_;
          auVar23._0_4_ = auVar115._0_4_;
          auVar23._8_4_ = auVar115._8_4_;
          auVar23._12_4_ = auVar115._8_4_;
          auVar128 = pshuflw(auVar142,auVar23,0xe8);
          auVar104._0_4_ = -(uint)(auVar125._0_4_ == iVar45);
          auVar104._4_4_ = -(uint)(auVar125._4_4_ == iVar46);
          auVar104._8_4_ = -(uint)(auVar125._8_4_ == iVar47);
          auVar104._12_4_ = -(uint)(auVar125._12_4_ == iVar127);
          auVar132._4_4_ = auVar104._4_4_;
          auVar132._0_4_ = auVar104._4_4_;
          auVar132._8_4_ = auVar104._12_4_;
          auVar132._12_4_ = auVar104._12_4_;
          auVar125 = pshuflw(auVar104,auVar132,0xe8);
          auVar133._4_4_ = auVar115._4_4_;
          auVar133._0_4_ = auVar115._4_4_;
          auVar133._8_4_ = auVar115._12_4_;
          auVar133._12_4_ = auVar115._12_4_;
          auVar102 = pshuflw(auVar115,auVar133,0xe8);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 & auVar128,(auVar102 | auVar125 & auVar128) ^ auVar13);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 9] = 0;
          }
          auVar24._4_4_ = auVar115._0_4_;
          auVar24._0_4_ = auVar115._0_4_;
          auVar24._8_4_ = auVar115._8_4_;
          auVar24._12_4_ = auVar115._8_4_;
          auVar133 = auVar132 & auVar24 | auVar133;
          auVar102 = packssdw(auVar133,auVar133);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125,auVar102 ^ auVar14);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._4_2_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 0xb] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108050) ^ _DAT_00108090;
          auVar116._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar116._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar116._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar116._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar134._4_4_ = auVar116._0_4_;
          auVar134._0_4_ = auVar116._0_4_;
          auVar134._8_4_ = auVar116._8_4_;
          auVar134._12_4_ = auVar116._8_4_;
          iVar141 = -(uint)(auVar125._4_4_ == iVar46);
          iVar145 = -(uint)(auVar125._12_4_ == iVar127);
          auVar25._4_4_ = iVar141;
          auVar25._0_4_ = iVar141;
          auVar25._8_4_ = iVar145;
          auVar25._12_4_ = iVar145;
          auVar143._4_4_ = auVar116._4_4_;
          auVar143._0_4_ = auVar116._4_4_;
          auVar143._8_4_ = auVar116._12_4_;
          auVar143._12_4_ = auVar116._12_4_;
          auVar125 = auVar25 & auVar134 | auVar143;
          auVar125 = packssdw(auVar125,auVar125);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 ^ auVar15,auVar125 ^ auVar15);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 0xd] = 0;
          }
          auVar125 = pshufhw(auVar125,auVar134,0x84);
          auVar26._4_4_ = iVar141;
          auVar26._0_4_ = iVar141;
          auVar26._8_4_ = iVar145;
          auVar26._12_4_ = iVar145;
          auVar128 = pshufhw(auVar116,auVar26,0x84);
          auVar102 = pshufhw(auVar125,auVar143,0x84);
          auVar105._8_4_ = 0xffffffff;
          auVar105._0_8_ = 0xffffffffffffffff;
          auVar105._12_4_ = 0xffffffff;
          auVar105 = (auVar102 | auVar128 & auVar125) ^ auVar105;
          auVar125 = packssdw(auVar105,auVar105);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._6_2_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 0xf] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108040) ^ _DAT_00108090;
          auVar117._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar117._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar117._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar117._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar27._4_4_ = auVar117._0_4_;
          auVar27._0_4_ = auVar117._0_4_;
          auVar27._8_4_ = auVar117._8_4_;
          auVar27._12_4_ = auVar117._8_4_;
          auVar128 = pshuflw(auVar143,auVar27,0xe8);
          auVar106._0_4_ = -(uint)(auVar125._0_4_ == iVar45);
          auVar106._4_4_ = -(uint)(auVar125._4_4_ == iVar46);
          auVar106._8_4_ = -(uint)(auVar125._8_4_ == iVar47);
          auVar106._12_4_ = -(uint)(auVar125._12_4_ == iVar127);
          auVar135._4_4_ = auVar106._4_4_;
          auVar135._0_4_ = auVar106._4_4_;
          auVar135._8_4_ = auVar106._12_4_;
          auVar135._12_4_ = auVar106._12_4_;
          auVar125 = pshuflw(auVar106,auVar135,0xe8);
          auVar136._4_4_ = auVar117._4_4_;
          auVar136._0_4_ = auVar117._4_4_;
          auVar136._8_4_ = auVar117._12_4_;
          auVar136._12_4_ = auVar117._12_4_;
          auVar102 = pshuflw(auVar117,auVar136,0xe8);
          auVar118._8_4_ = 0xffffffff;
          auVar118._0_8_ = 0xffffffffffffffff;
          auVar118._12_4_ = 0xffffffff;
          auVar118 = (auVar102 | auVar125 & auVar128) ^ auVar118;
          auVar102 = packssdw(auVar118,auVar118);
          auVar125 = packsswb(auVar125 & auVar128,auVar102);
          if ((auVar125 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 0x11] = 0;
          }
          auVar28._4_4_ = auVar117._0_4_;
          auVar28._0_4_ = auVar117._0_4_;
          auVar28._8_4_ = auVar117._8_4_;
          auVar28._12_4_ = auVar117._8_4_;
          auVar136 = auVar135 & auVar28 | auVar136;
          auVar102 = packssdw(auVar136,auVar136);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar102 = packssdw(auVar102 ^ auVar16,auVar102 ^ auVar16);
          auVar125 = packsswb(auVar125,auVar102);
          if ((auVar125._8_2_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 0x13] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108030) ^ _DAT_00108090;
          auVar119._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar119._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar119._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar119._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar137._4_4_ = auVar119._0_4_;
          auVar137._0_4_ = auVar119._0_4_;
          auVar137._8_4_ = auVar119._8_4_;
          auVar137._12_4_ = auVar119._8_4_;
          iVar141 = -(uint)(auVar125._4_4_ == iVar46);
          iVar145 = -(uint)(auVar125._12_4_ == iVar127);
          auVar29._4_4_ = iVar141;
          auVar29._0_4_ = iVar141;
          auVar29._8_4_ = iVar145;
          auVar29._12_4_ = iVar145;
          auVar144._4_4_ = auVar119._4_4_;
          auVar144._0_4_ = auVar119._4_4_;
          auVar144._8_4_ = auVar119._12_4_;
          auVar144._12_4_ = auVar119._12_4_;
          auVar125 = auVar29 & auVar137 | auVar144;
          auVar125 = packssdw(auVar125,auVar125);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 ^ auVar17,auVar125 ^ auVar17);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 0x15] = 0;
          }
          auVar125 = pshufhw(auVar125,auVar137,0x84);
          auVar30._4_4_ = iVar141;
          auVar30._0_4_ = iVar141;
          auVar30._8_4_ = iVar145;
          auVar30._12_4_ = iVar145;
          auVar128 = pshufhw(auVar119,auVar30,0x84);
          auVar102 = pshufhw(auVar125,auVar144,0x84);
          auVar107._8_4_ = 0xffffffff;
          auVar107._0_8_ = 0xffffffffffffffff;
          auVar107._12_4_ = 0xffffffff;
          auVar107 = (auVar102 | auVar128 & auVar125) ^ auVar107;
          auVar125 = packssdw(auVar107,auVar107);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._10_2_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 0x17] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108020) ^ _DAT_00108090;
          auVar120._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar120._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar120._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar120._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar31._4_4_ = auVar120._0_4_;
          auVar31._0_4_ = auVar120._0_4_;
          auVar31._8_4_ = auVar120._8_4_;
          auVar31._12_4_ = auVar120._8_4_;
          auVar128 = pshuflw(auVar144,auVar31,0xe8);
          auVar108._0_4_ = -(uint)(auVar125._0_4_ == iVar45);
          auVar108._4_4_ = -(uint)(auVar125._4_4_ == iVar46);
          auVar108._8_4_ = -(uint)(auVar125._8_4_ == iVar47);
          auVar108._12_4_ = -(uint)(auVar125._12_4_ == iVar127);
          auVar138._4_4_ = auVar108._4_4_;
          auVar138._0_4_ = auVar108._4_4_;
          auVar138._8_4_ = auVar108._12_4_;
          auVar138._12_4_ = auVar108._12_4_;
          auVar125 = pshuflw(auVar108,auVar138,0xe8);
          auVar139._4_4_ = auVar120._4_4_;
          auVar139._0_4_ = auVar120._4_4_;
          auVar139._8_4_ = auVar120._12_4_;
          auVar139._12_4_ = auVar120._12_4_;
          auVar102 = pshuflw(auVar120,auVar139,0xe8);
          auVar18._8_4_ = 0xffffffff;
          auVar18._0_8_ = 0xffffffffffffffff;
          auVar18._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 & auVar128,(auVar102 | auVar125 & auVar128) ^ auVar18);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 0x19] = 0;
          }
          auVar32._4_4_ = auVar120._0_4_;
          auVar32._0_4_ = auVar120._0_4_;
          auVar32._8_4_ = auVar120._8_4_;
          auVar32._12_4_ = auVar120._8_4_;
          auVar139 = auVar138 & auVar32 | auVar139;
          auVar102 = packssdw(auVar139,auVar139);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125,auVar102 ^ auVar19);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125._12_2_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 0x1b] = 0;
          }
          auVar125 = (auVar123 | _DAT_00108010) ^ _DAT_00108090;
          auVar109._0_4_ = -(uint)(iVar45 < auVar125._0_4_);
          auVar109._4_4_ = -(uint)(iVar46 < auVar125._4_4_);
          auVar109._8_4_ = -(uint)(iVar47 < auVar125._8_4_);
          auVar109._12_4_ = -(uint)(iVar127 < auVar125._12_4_);
          auVar140._4_4_ = auVar109._0_4_;
          auVar140._0_4_ = auVar109._0_4_;
          auVar140._8_4_ = auVar109._8_4_;
          auVar140._12_4_ = auVar109._8_4_;
          auVar124._4_4_ = -(uint)(auVar125._4_4_ == iVar46);
          auVar124._12_4_ = -(uint)(auVar125._12_4_ == iVar127);
          auVar124._0_4_ = auVar124._4_4_;
          auVar124._8_4_ = auVar124._12_4_;
          auVar126._4_4_ = auVar109._4_4_;
          auVar126._0_4_ = auVar109._4_4_;
          auVar126._8_4_ = auVar109._12_4_;
          auVar126._12_4_ = auVar109._12_4_;
          auVar102 = auVar124 & auVar140 | auVar126;
          auVar125 = packssdw(auVar109,auVar102);
          auVar20._8_4_ = 0xffffffff;
          auVar20._0_8_ = 0xffffffffffffffff;
          auVar20._12_4_ = 0xffffffff;
          auVar125 = packssdw(auVar125 ^ auVar20,auVar125 ^ auVar20);
          auVar125 = packsswb(auVar125,auVar125);
          if ((auVar125 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4036[uVar57 * 2 + lVar58 + 0x1d] = 0;
          }
          auVar125 = pshufhw(auVar125,auVar140,0x84);
          in_XMM2 = pshufhw(auVar102,auVar124,0x84);
          in_XMM2 = in_XMM2 & auVar125;
          auVar125 = pshufhw(auVar125,auVar126,0x84);
          auVar110._8_4_ = 0xffffffff;
          auVar110._0_8_ = 0xffffffffffffffff;
          auVar110._12_4_ = 0xffffffff;
          auVar110 = (auVar125 | in_XMM2) ^ auVar110;
          auVar125 = packssdw(auVar110,auVar110);
          in_XMM1 = packsswb(auVar125,auVar125);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            local_4036[uVar57 * 2 + lVar58 + 0x1f] = 0;
          }
          uVar57 = uVar57 + 0x10;
        } while ((lVar81 + 0xfU & 0xfffffffffffffff0) != uVar57);
      }
      lVar58 = 0;
      memset(local_3420,0,0x1200);
      local_4380 = dec->qmf_state;
      uVar57 = 0;
      do {
        bVar44 = local_4038;
        local_4360 = (uint8_t *)lVar58;
        local_4368 = (L3_gr_info_t *)uVar57;
        local_4370 = local_3420 + (int)uVar57;
        uVar66 = local_4388->layer;
        uVar78 = (ulong)local_4038;
        local_4378 = (long)(int)uVar66 | 1;
        uVar57 = (ulong)uVar66 | 1;
        uVar77 = (uint)local_4038;
        iVar45 = 0x240;
        lVar58 = 0;
        do {
          local_43c8 = (uint)bVar44;
          local_43b0 = (undefined1 (*) [16])lVar58;
          if (local_43c8 != 0) {
            pfVar70 = local_4370 + lVar58 * local_4378;
            uVar86 = 0;
            do {
              bVar75 = local_4036[uVar86];
              if (bVar75 != 0) {
                if (bVar75 < 0x11) {
                  if (-1 < (int)uVar66) {
                    uVar87 = 0;
                    do {
                      uVar49 = get_bits(&local_43a8,(uint)bVar75);
                      pfVar70[uVar87] = (float)(int)(uVar49 + (-1 << (bVar75 - 1 & 0x1f)) + 1);
                      uVar87 = uVar87 + 1;
                    } while (uVar57 != uVar87);
                  }
                }
                else {
                  uVar61 = 2 << (bVar75 - 0x11 & 0x1f);
                  uVar49 = get_bits(&local_43a8,(uVar61 - (uVar61 >> 3)) + 3);
                  if (-1 < (int)uVar66) {
                    uVar87 = 0;
                    do {
                      pfVar70[uVar87] = (float)(int)(uVar49 % (uVar61 + 1) - (uVar61 >> 1));
                      uVar87 = uVar87 + 1;
                      uVar49 = uVar49 / (uVar61 + 1);
                    } while (uVar57 != uVar87);
                  }
                }
              }
              pfVar70 = pfVar70 + iVar45;
              iVar45 = 0x12 - iVar45;
              uVar86 = uVar86 + 1;
            } while (uVar86 != uVar77 * 2);
          }
          lVar58 = (long)local_43b0 + 1;
        } while (lVar58 != 4);
        uVar66 = (int)local_4368 + (int)uVar57 * 4;
        uVar57 = (ulong)uVar66;
        if (uVar66 == 0xc) {
          memcpy(local_2b20 + (uint)local_4037 * 0x48,
                 (void *)((ulong)((uint)local_4037 * 0x48) + (long)local_3420),
                 (uVar78 - local_4037) * 0x48);
          puVar50 = local_4360;
          pmVar65 = local_4388;
          pmVar85 = local_4390;
          if (local_43c8 != 0) {
            pfVar53 = (float *)(&local_4338 + (long)local_4360);
            uVar66 = 0;
            pfVar70 = local_3420;
            do {
              fVar90 = *pfVar53;
              fVar93 = pfVar53[3];
              lVar58 = 0;
              do {
                pfVar72 = pfVar70 + lVar58;
                fVar94 = pfVar72[1];
                fVar34 = pfVar72[2];
                fVar35 = pfVar72[3];
                pfVar74 = pfVar70 + lVar58;
                *pfVar74 = *pfVar72 * fVar90;
                pfVar74[1] = fVar94 * fVar90;
                pfVar74[2] = fVar34 * fVar90;
                pfVar74[3] = fVar35 * fVar90;
                pfVar72 = pfVar70 + lVar58 + 0x240;
                auVar121._0_4_ = *pfVar72 * fVar93;
                auVar121._4_4_ = pfVar72[1] * fVar93;
                auVar121._8_4_ = pfVar72[2] * fVar93;
                auVar121._12_4_ = pfVar72[3] * fVar93;
                *(undefined1 (*) [16])(pfVar70 + lVar58 + 0x240) = auVar121;
                lVar58 = lVar58 + 4;
              } while (lVar58 != 0xc);
              uVar66 = uVar66 + 1;
              pfVar70 = pfVar70 + 0x12;
              pfVar53 = pfVar53 + 6;
            } while (uVar66 != local_43c8);
          }
          mp3d_synth_granule(local_4380,local_3420,0xc,local_4388->channels,local_4390,local_2180);
          uVar57 = 0;
          memset(local_3420,0,0x1200);
          local_4390 = pmVar85 + (long)pmVar65->channels * 0x180;
          local_4360 = puVar50;
        }
        if (local_43a8.limit < local_43a8.pos) {
          dec->header[0] = '\0';
          return 0;
        }
        lVar58 = (long)local_4360 + 1;
      } while (lVar58 != 3);
      uVar66 = 1;
    }
    uVar77 = 0x180;
    if ((~dec->header[1] & 6) != 0) {
      uVar77 = 0x480 >> ((dec->header[1] & 0xe) == 2);
    }
    uVar66 = uVar77 * uVar66;
  }
  return uVar66;
}

Assistant:

int mp3dec_decode_frame(mp3dec_t *dec, const uint8_t *mp3, int mp3_bytes, mp3d_sample_t *pcm, mp3dec_frame_info_t *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const uint8_t *hdr;
    bs_t bs_frame[1];
    mp3dec_scratch_t scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && hdr_compare(dec->header, mp3))
    {
        frame_size = hdr_frame_bytes(mp3, dec->free_format_bytes) + hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + HDR_SIZE > mp3_bytes || !hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(mp3dec_t));
        i = mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->frame_offset = i;
    info->channels = HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = hdr_sample_rate_hz(hdr);
    info->layer = 4 - HDR_GET_LAYER(hdr);
    info->bitrate_kbps = hdr_bitrate_kbps(hdr);

    if (!pcm)
    {
        return hdr_frame_samples(hdr);
    }

    bs_init(bs_frame, hdr + HDR_SIZE, frame_size - HDR_SIZE);
    if (HDR_IS_CRC(hdr))
    {
        get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            mp3dec_init(dec);
            return 0;
        }
        success = L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success)
        {
            for (igr = 0; igr < (HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm += 576*info->channels)
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, pcm, scratch.syn[0]);
            }
        }
        L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MINIMP3_ONLY_MP3
        return 0;
#else /* MINIMP3_ONLY_MP3 */
        L12_scale_info sci[1];
        L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm += 384*info->channels;
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                mp3dec_init(dec);
                return 0;
            }
        }
#endif /* MINIMP3_ONLY_MP3 */
    }
    return success*hdr_frame_samples(dec->header);
}